

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

int tidyDocSaveBuffer(TidyDocImpl *doc,TidyBuffer *outbuf)

{
  StreamOut *out_00;
  StreamOut *out;
  uint nl;
  uint outenc;
  int status;
  TidyBuffer *outbuf_local;
  TidyDocImpl *doc_local;
  
  nl = 0xffffffea;
  if (outbuf != (TidyBuffer *)0x0) {
    out_00 = prvTidyBufferOutput(doc,outbuf,(int)(doc->config).value[6].v,
                                 (uint)(doc->config).value[7].v);
    nl = tidyDocSaveStream(doc,out_00);
    (*doc->allocator->vtbl->free)(doc->allocator,out_00);
  }
  return nl;
}

Assistant:

int         tidyDocSaveBuffer( TidyDocImpl* doc, TidyBuffer* outbuf )
{
    int status = -EINVAL;
    if ( outbuf )
    {
        uint outenc = cfg( doc, TidyOutCharEncoding );
        uint nl = cfg( doc, TidyNewline );
        StreamOut* out = TY_(BufferOutput)( doc, outbuf, outenc, nl );

        status = tidyDocSaveStream( doc, out );
        TidyDocFree( doc, out );
    }
    return status;
}